

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O3

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::smokeTest(DecimalMatcher *this,StringSegment *segment)

{
  bool bVar1;
  UBool UVar2;
  UChar32 c;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  if (((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
       (UnicodeString *)0x0) && (this->leadSet != (UnicodeSet *)0x0)) {
    bVar1 = StringSegment::startsWith(segment,this->leadSet);
    return bVar1;
  }
  bVar1 = StringSegment::startsWith(segment,this->separatorSet);
  bVar5 = true;
  if (!bVar1) {
    c = StringSegment::getCodePoint(segment);
    UVar2 = u_isdigit_63(c);
    if (UVar2 == '\0') {
      if ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
          (UnicodeString *)0x0) {
        bVar5 = false;
      }
      else {
        uVar4 = 0xffffffffffffffff;
        lVar3 = 0;
        do {
          bVar1 = StringSegment::startsWith
                            (segment,(UnicodeString *)
                                     ((long)&(((this->fLocalDigitStrings).
                                               super_LocalPointerBase<const_icu_63::UnicodeString>.
                                              ptr)->super_Replaceable).super_UObject._vptr_UObject +
                                     lVar3));
          if (bVar1) {
            return true;
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x40;
          bVar5 = uVar4 < 9;
        } while (uVar4 != 9);
      }
    }
  }
  return bVar5;
}

Assistant:

bool DecimalMatcher::smokeTest(const StringSegment& segment) const {
    // The common case uses a static leadSet for efficiency.
    if (fLocalDigitStrings.isNull() && leadSet != nullptr) {
        return segment.startsWith(*leadSet);
    }
    if (segment.startsWith(*separatorSet) || u_isdigit(segment.getCodePoint())) {
        return true;
    }
    if (fLocalDigitStrings.isNull()) {
        return false;
    }
    for (int32_t i = 0; i < 10; i++) {
        if (segment.startsWith(fLocalDigitStrings[i])) {
            return true;
        }
    }
    return false;
}